

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMD.cpp
# Opt level: O2

int __thiscall OpenMD::RNEMD::RNEMD::getBin(RNEMD *this,Vector3d *pos)

{
  uint uVar1;
  double dVar2;
  Vector3d rPos;
  Vector<double,_3U> VStack_48;
  Vector<double,_3U> local_30;
  
  if (this->usePeriodicBoundaryConditions_ == true) {
    Snapshot::wrapVector(this->currentSnap_,pos);
    uVar1 = (uint)(int)(((pos->super_Vector<double,_3U>).data_[this->rnemdPrivilegedAxis_] /
                         *(double *)
                          ((long)(this->hmat_).super_SquareMatrix<double,_3>.
                                 super_RectMatrix<double,_3U,_3U>.data_ +
                          (ulong)this->rnemdPrivilegedAxis_ * 0x20) + 0.5) * (double)this->nBins_) %
            this->nBins_;
  }
  else {
    operator-(&VStack_48,&pos->super_Vector<double,_3U>,
              &(this->coordinateOrigin_).super_Vector<double,_3U>);
    Vector<double,_3U>::Vector(&local_30,&VStack_48);
    dVar2 = Vector<double,_3U>::length(&local_30);
    uVar1 = (uint)(dVar2 / this->binWidth_);
  }
  return uVar1;
}

Assistant:

int RNEMD::getBin(Vector3d pos) {
    if (usePeriodicBoundaryConditions_) {
      currentSnap_->wrapVector(pos);

      return int(nBins_ *
                 (pos[rnemdPrivilegedAxis_] /
                      hmat_(rnemdPrivilegedAxis_, rnemdPrivilegedAxis_) +
                  0.5)) %
             nBins_;
    } else {
      Vector3d rPos = pos - coordinateOrigin_;
      return int(rPos.length() / binWidth_);
    }
  }